

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzAddMod_fast(word *c,word *a,word *b,word *mod,size_t n)

{
  int iVar1;
  word wVar2;
  
  wVar2 = zzAdd(c,a,b,n);
  if (wVar2 == 0) {
    iVar1 = wwCmp_fast(c,mod,n);
    if (iVar1 < 0) {
      return;
    }
  }
  zzSub2(c,mod,n);
  return;
}

Assistant:

void FAST(zzAddMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	if (zzAdd(c, a, b, n) || FAST(wwCmp)(c, mod, n) >= 0)
		zzSub2(c, mod, n);
}